

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O1

void __thiscall implementations::scheme::SchemeFrame::nextExpression(SchemeFrame *this)

{
  cell *pcVar1;
  cell *pcVar2;
  
  pcVar1 = (this->expressions).
           super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pcVar2 = (this->exp_it)._M_current;
  if (pcVar2 != pcVar1) {
    pcVar2 = pcVar2 + 1;
    (this->exp_it)._M_current = pcVar2;
    if (pcVar2 != pcVar1) {
      setExpression(this,pcVar2);
      this->resolved = false;
      return;
    }
  }
  this->resolved = true;
  (this->exp).type = nil;
  std::__cxx11::string::_M_assign((string *)&(this->exp).val);
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  operator=(&(this->exp).list,
            (vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_> *
            )&DAT_001313d8);
  (this->exp).proc = DAT_001313f0;
  (this->exp).env.
  super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       DAT_001313f8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->exp).env.
              super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&DAT_00131400);
  return;
}

Assistant:

void nextExpression() {
		if (exp_it != expressions.cend()) {
			++exp_it;
			if (exp_it != expressions.cend()) {
				setExpression(*exp_it);
				resolved = false;
			} else {
				resolved = true;
				exp = nil;
			}
		} else {
			resolved = true;
			exp = nil;
		}
	}